

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_map * mg_map_make_empty(uint32_t capacity)

{
  mg_map *pmVar1;
  
  pmVar1 = (mg_map *)mg_allocator_malloc(&mg_system_allocator,(ulong)capacity * 0x10 + 0x18);
  if (pmVar1 != (mg_map *)0x0) {
    pmVar1->keys = (mg_string **)(pmVar1 + 1);
    pmVar1->values = (mg_value **)(&pmVar1[1].size + (ulong)capacity * 2);
    pmVar1->size = 0;
    pmVar1->capacity = capacity;
  }
  return pmVar1;
}

Assistant:

mg_map *mg_map_make_empty(uint32_t capacity) {
  mg_map *map = mg_map_alloc(capacity, &mg_system_allocator);
  if (!map) {
    return NULL;
  }
  map->size = 0;
  map->capacity = capacity;
  return map;
}